

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

RecyclableObject *
Js::JavascriptOperators::IteratorNext
          (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
          Var value)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  bool bVar2;
  bool bVar3;
  Attributes attributes;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  anon_class_24_3_b5d8a029 local_48;
  
  this = scriptContext->threadContext;
  bVar3 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_48.iterator = iterator;
  local_48.value = value;
  local_48.nextFunc = nextFunc;
  attributes = FunctionInfo::GetAttributes(nextFunc);
  bVar2 = ThreadContext::HasNoSideEffect(this,nextFunc,attributes);
  if (bVar2) {
    pRVar5 = (RecyclableObject *)IteratorNext::anon_class_24_3_b5d8a029::operator()(&local_48);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      pRVar5 = (((((((((nextFunc->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_009ab62d;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this->implicitCallFlags;
      pRVar5 = (RecyclableObject *)IteratorNext::anon_class_24_3_b5d8a029::operator()(&local_48);
      this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_009ab62d;
    }
    pRVar5 = (RecyclableObject *)IteratorNext::anon_class_24_3_b5d8a029::operator()(&local_48);
    bVar2 = ThreadContext::IsOnStack(pRVar5);
  }
  if (bVar2 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_009ab62d:
  this->reentrancySafeOrHandled = bVar3;
  BVar4 = IsObject(pRVar5);
  if (BVar4 != 0) {
    pRVar5 = VarTo<Js::RecyclableObject>(pRVar5);
    return pRVar5;
  }
  bVar3 = ThreadContext::RecordImplicitException(this);
  if (!bVar3) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec71,(PCWSTR)0x0);
}

Assistant:

RecyclableObject* JavascriptOperators::IteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, Var value)
    {
        ThreadContext *threadContext = scriptContext->GetThreadContext();

        Var result = threadContext->ExecuteImplicitCall(nextFunc, ImplicitCall_Accessor, [=]() -> Var
            {
                Js::Var args[] = { iterator, value };
                Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args) + (value == nullptr ? -1 : 0));
                return JavascriptFunction::CallFunction<true>(nextFunc, nextFunc->GetEntryPoint(), Arguments(callInfo, args));
            });

        if (!JavascriptOperators::IsObject(result))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
        }

        return VarTo<RecyclableObject>(result);
    }